

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Sym * __thiscall GlobOpt::SetSymStore(GlobOpt *this,ValueInfo *valueInfo,Sym *sym)

{
  StackSym *this_00;
  
  if (sym->m_kind == SymKindStack) {
    this_00 = Sym::AsStackSym(sym);
    if ((this_00->field_0x1a & 1) != 0) {
      sym = &StackSym::GetVarEquivSym(this_00,this->func)->super_Sym;
    }
  }
  if ((valueInfo->symStore == (Sym *)0x0) || (valueInfo->symStore->m_kind == SymKindProperty)) {
    SetSymStoreDirect(this,valueInfo,sym);
  }
  return &((StackSym *)sym)->super_Sym;
}

Assistant:

Sym *
GlobOpt::SetSymStore(ValueInfo *valueInfo, Sym *sym)
{
    if (sym->IsStackSym())
    {
        StackSym *stackSym = sym->AsStackSym();

        if (stackSym->IsTypeSpec())
        {
            stackSym = stackSym->GetVarEquivSym(this->func);
            sym = stackSym;
        }
    }
    if (valueInfo->GetSymStore() == nullptr || valueInfo->GetSymStore()->IsPropertySym())
    {
        SetSymStoreDirect(valueInfo, sym);
    }

    return sym;
}